

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsCompiler.cxx
# Opt level: O2

bool __thiscall
cmDependsCompiler::CheckDependencies
          (cmDependsCompiler *this,string *internalDepFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depFiles,DependencyMap *dependencies,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *isValidPath)

{
  char *pcVar1;
  key_type *__k;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  istream *piVar7;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar8;
  string *psVar9;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  mapped_type *pmVar10;
  value_type *__rhs;
  long lVar11;
  long lVar12;
  undefined8 uVar13;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  string depender;
  string line;
  cmFileTime internalDepFileTime;
  cmFileTime depFileTime;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_278;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_258;
  ifstream fin;
  undefined8 local_230;
  bool local_220;
  byte abStack_218 [488];
  
  internalDepFileTime.Time = 0;
  bVar2 = cmsys::SystemTools::FileExists(internalDepFile);
  if (bVar2) {
    cmFileTime::Load(&internalDepFileTime,internalDepFile);
    std::ifstream::ifstream(&fin,(internalDepFile->_M_dataplus)._M_p,_S_in);
    if ((abStack_218
         [(long)(((pointer)(_fin + -0x30))->paths).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start] & 5) == 0) {
      line._M_dataplus._M_p = (pointer)&line.field_2;
      line._M_string_length = 0;
      pvVar8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0;
      depender._M_dataplus._M_p = (pointer)&depender.field_2;
      depender._M_string_length = 0;
      line.field_2._M_local_buf[0] = '\0';
      depender.field_2._M_allocated_capacity =
           depender.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_004d18a7:
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fin,(string *)&line);
      if (((&piVar7->field_0x20)[(long)piVar7->_vptr_basic_istream[-3]] & 5) == 0) {
        if ((line._M_string_length != 0) && (cVar3 = *line._M_dataplus._M_p, cVar3 != '#')) {
          if (line._M_dataplus._M_p[line._M_string_length - 1] == '\r') {
            std::__cxx11::string::pop_back();
            if (line._M_string_length == 0) goto LAB_004d18a7;
            cVar3 = *line._M_dataplus._M_p;
          }
          if (cVar3 == ' ') {
            if (pvVar8 != (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0)
            {
              std::__cxx11::string::substr((ulong)&depFileTime,(ulong)&line);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        (pvVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&depFileTime);
              std::__cxx11::string::~string((string *)&depFileTime);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)&depender,(string *)&line);
            pvVar8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator[](dependencies,&depender);
          }
        }
        goto LAB_004d18a7;
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&depender);
      std::__cxx11::string::~string((string *)&line);
    }
    std::ifstream::~ifstream(&fin);
  }
  depFileTime.Time = 0;
  __rhs = (depFiles->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  bVar5 = true;
  do {
    if (__rhs == (depFiles->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      return bVar5;
    }
    psVar9 = __rhs + 3;
    bVar4 = cmsys::SystemTools::FileExists(psVar9);
    if ((bVar4) &&
       ((!bVar2 ||
        (cmFileTime::Load(&depFileTime,psVar9), internalDepFileTime.Time <= depFileTime.Time)))) {
      if (this->Verbose == true) {
        cmStrCat<char_const(&)[20],std::__cxx11::string_const&,char_const(&)[31],std::__cxx11::string_const&,char_const(&)[4]>
                  ((string *)&fin,(char (*) [20])"Dependencies file \"",psVar9,
                   (char (*) [31])"\" is newer than depends file \"",internalDepFile,
                   (char (*) [4])0x6f03f7);
        cmSystemTools::Stdout((string *)&fin);
        std::__cxx11::string::~string((string *)&fin);
      }
      depender.field_2._M_allocated_capacity = 0;
      depender._M_dataplus._M_p = (pointer)0x0;
      depender._M_string_length = 0;
      __y._M_str = "custom";
      __y._M_len = 6;
      __x._M_str = __rhs[2]._M_dataplus._M_p;
      __x._M_len = __rhs[2]._M_string_length;
      bVar5 = std::operator==(__x,__y);
      if (bVar5) {
        pcVar1 = (psVar9->_M_dataplus)._M_p;
        psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           ((cmLocalGenerator *)this->LocalGenerator);
        cmReadGccDepfile((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                          *)&fin,pcVar1,psVar9,All);
        uVar13 = _fin;
        if (local_220 != false) {
          for (; uVar13 != local_230; uVar13 = (pointer)(uVar13 + 0x30)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&depender,&((pointer)uVar13)->paths);
            if ((isValidPath->super__Function_base)._M_manager != (_Manager_type)0x0) {
              std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_258,isValidPath);
              ::cm::
              erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::function<bool(std::__cxx11::string_const&)>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&depender,&local_258);
              std::_Function_base::~_Function_base(&local_258.super__Function_base);
            }
            lVar12 = (long)(((pointer)uVar13)->rules).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(((pointer)uVar13)->rules).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar11 = lVar12 >> 5;
            while( true ) {
              __k = (((pointer)uVar13)->rules).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              lVar11 = lVar11 + -1;
              if (lVar11 == 0) break;
              pvVar8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                       ::operator[](dependencies,
                                    (key_type *)((long)&__k[-1]._M_dataplus._M_p + lVar12));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                        (pvVar8,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  **)(pvVar8 + 8),
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )depender._M_dataplus._M_p,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          )depender._M_string_length);
              lVar12 = lVar12 + -0x20;
            }
            __result.container =
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](dependencies,__k);
            std::__copy_move<true,false,std::random_access_iterator_tag>::
            __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       depender._M_dataplus._M_p,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       depender._M_string_length,__result);
          }
        }
LAB_004d1cb6:
        std::
        _Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
        ::_M_reset((_Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                    *)&fin);
      }
      else {
        __y_00._M_str = "msvc";
        __y_00._M_len = 4;
        __x_00._M_str = __rhs[2]._M_dataplus._M_p;
        __x_00._M_len = __rhs[2]._M_string_length;
        bVar5 = std::operator==(__x_00,__y_00);
        if (bVar5) {
          std::ifstream::ifstream((istream *)&fin,(psVar9->_M_dataplus)._M_p,_S_in);
          if ((abStack_218
               [(long)(((pointer)(_fin + -0x30))->paths).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start] & 5) == 0) {
            line._M_dataplus._M_p = (pointer)&line.field_2;
            line._M_string_length = 0;
            line.field_2._M_local_buf[0] = '\0';
            if (((isValidPath->super__Function_base)._M_manager == (_Manager_type)0x0) &&
               (__rhs->_M_string_length != 0)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&depender,__rhs);
            }
            while (bVar5 = cmsys::SystemTools::GetLineFromStream
                                     ((istream *)&fin,&line,(bool *)0x0,0xffffffffffffffff), bVar5)
            {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &depender,&line);
            }
            std::__cxx11::string::~string((string *)&line);
            std::ifstream::~ifstream((istream *)&fin);
LAB_004d1d75:
            if ((isValidPath->super__Function_base)._M_manager != (_Manager_type)0x0) {
              std::
              function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_278,isValidPath);
              ::cm::
              erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::function<bool(std::__cxx11::string_const&)>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&depender,&local_278);
              std::_Function_base::~_Function_base(&local_278.super__Function_base);
              if (__rhs->_M_string_length != 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&depender,(const_iterator)depender._M_dataplus._M_p,__rhs);
              }
            }
            pmVar10 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      ::operator[](dependencies,__rhs + 1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(pmVar10,&depender);
          }
          else {
            std::ifstream::~ifstream((istream *)&fin);
          }
        }
        else {
          __y_01._M_str = "gcc";
          __y_01._M_len = 3;
          __x_01._M_str = __rhs[2]._M_dataplus._M_p;
          __x_01._M_len = __rhs[2]._M_string_length;
          bVar5 = std::operator==(__x_01,__y_01);
          if (bVar5) {
            pcVar1 = (psVar9->_M_dataplus)._M_p;
            psVar9 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                               ((cmLocalGenerator *)this->LocalGenerator);
            cmReadGccDepfile((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                              *)&fin,pcVar1,psVar9,Deps);
            if ((local_220 != false) &&
               (std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&depender,&((pointer)_fin)->paths),
               depender._M_dataplus._M_p != (pointer)depender._M_string_length)) {
              _Var6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)depender._M_dataplus._M_p,__rhs + 1);
              if (_Var6) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&depender,(const_iterator)depender._M_dataplus._M_p);
              }
              if (__rhs->_M_string_length != 0) {
                bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)depender._M_dataplus._M_p,__rhs);
                if (bVar5) {
                  ::cm::
                  erase<std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__cxx11::string>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&depender,__rhs);
                  if ((isValidPath->super__Function_base)._M_manager == (_Manager_type)0x0) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&depender,(const_iterator)depender._M_dataplus._M_p,__rhs);
                  }
                }
                else if ((isValidPath->super__Function_base)._M_manager != (_Manager_type)0x0) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&depender,(const_iterator)depender._M_dataplus._M_p);
                }
              }
              std::
              _Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
              ::_M_reset((_Optional_payload_base<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                          *)&fin);
              goto LAB_004d1d75;
            }
            goto LAB_004d1cb6;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&depender);
      bVar5 = false;
    }
    __rhs = __rhs + 4;
  } while( true );
}

Assistant:

bool cmDependsCompiler::CheckDependencies(
  const std::string& internalDepFile, const std::vector<std::string>& depFiles,
  cmDepends::DependencyMap& dependencies,
  const std::function<bool(const std::string&)>& isValidPath)
{
  bool status = true;
  bool forceReadDeps = true;

  cmFileTime internalDepFileTime;
  // read cached dependencies stored in internal file
  if (cmSystemTools::FileExists(internalDepFile)) {
    internalDepFileTime.Load(internalDepFile);
    forceReadDeps = false;

    // read current dependencies
    cmsys::ifstream fin(internalDepFile.c_str());
    if (fin) {
      std::string line;
      std::string depender;
      std::vector<std::string>* currentDependencies = nullptr;
      while (std::getline(fin, line)) {
        if (line.empty() || line.front() == '#') {
          continue;
        }
        // Drop carriage return character at the end
        if (line.back() == '\r') {
          line.pop_back();
          if (line.empty()) {
            continue;
          }
        }
        // Check if this a depender line
        if (line.front() != ' ') {
          depender = std::move(line);
          currentDependencies = &dependencies[depender];
          continue;
        }
        // This is a dependee line
        if (currentDependencies != nullptr) {
          currentDependencies->emplace_back(line.substr(1));
        }
      }
      fin.close();
    }
  }

  // Now, update dependencies map with all new compiler generated
  // dependencies files
  cmFileTime depFileTime;
  for (auto dep = depFiles.begin(); dep != depFiles.end(); dep++) {
    const auto& source = *dep++;
    const auto& target = *dep++;
    const auto& format = *dep++;
    const auto& depFile = *dep;

    if (!cmSystemTools::FileExists(depFile)) {
      continue;
    }

    if (!forceReadDeps) {
      depFileTime.Load(depFile);
    }
    if (forceReadDeps || depFileTime.Compare(internalDepFileTime) >= 0) {
      status = false;
      if (this->Verbose) {
        cmSystemTools::Stdout(cmStrCat("Dependencies file \"", depFile,
                                       "\" is newer than depends file \"",
                                       internalDepFile, "\".\n"));
      }

      std::vector<std::string> depends;
      if (format == "custom"_s) {
        auto deps = cmReadGccDepfile(
          depFile.c_str(), this->LocalGenerator->GetCurrentBinaryDirectory());
        if (!deps) {
          continue;
        }

        for (auto& entry : *deps) {
          depends = std::move(entry.paths);
          if (isValidPath) {
            cm::erase_if(depends, isValidPath);
          }
          // copy depends for each target, except first one, which can be
          // moved
          for (auto index = entry.rules.size() - 1; index > 0; --index) {
            auto& rule_deps = dependencies[entry.rules[index]];
            rule_deps.insert(rule_deps.end(), depends.cbegin(),
                             depends.cend());
          }
          auto& rule_deps = dependencies[entry.rules.front()];
          std::move(depends.cbegin(), depends.cend(),
                    std::back_inserter(rule_deps));
        }
      } else {
        if (format == "msvc"_s) {
          cmsys::ifstream fin(depFile.c_str());
          if (!fin) {
            continue;
          }

          std::string line;
          if (!isValidPath && !source.empty()) {
            // insert source as first dependency
            depends.push_back(source);
          }
          while (cmSystemTools::GetLineFromStream(fin, line)) {
            depends.emplace_back(std::move(line));
          }
        } else if (format == "gcc"_s) {
          auto deps = cmReadGccDepfile(
            depFile.c_str(), this->LocalGenerator->GetCurrentBinaryDirectory(),
            GccDepfilePrependPaths::Deps);
          if (!deps) {
            continue;
          }

          // dependencies generated by the compiler contains only one target
          depends = std::move(deps->front().paths);
          if (depends.empty()) {
            // unexpectedly empty, ignore it and continue
            continue;
          }

          // depending of the effective format of the dependencies file
          // generated by the compiler, the target can be wrongly identified
          // as a dependency so remove it from the list
          if (depends.front() == target) {
            depends.erase(depends.begin());
          }

          // ensure source file is the first dependency
          if (!source.empty()) {
            if (depends.front() != source) {
              cm::erase(depends, source);
              if (!isValidPath) {
                depends.insert(depends.begin(), source);
              }
            } else if (isValidPath) {
              // remove first dependency because it must not be filtered out
              depends.erase(depends.begin());
            }
          }
        } else {
          // unknown format, ignore it
          continue;
        }

        if (isValidPath) {
          cm::erase_if(depends, isValidPath);
          if (!source.empty()) {
            // insert source as first dependency
            depends.insert(depends.begin(), source);
          }
        }

        dependencies[target] = std::move(depends);
      }
    }
  }

  return status;
}